

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O3

void kv_get_str_data_size_test(btree_kv_ops *kv_ops)

{
  _func_size_t_bnode_ptr_void_ptr_void_ptr_void_ptr_size_t *p_Var1;
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var2;
  anon_union_8_2_4f9aec01_for_bnode_4 aVar3;
  code *pcVar4;
  int iVar5;
  bnode *pbVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  ushort *__ptr;
  ushort *__ptr_00;
  char *pcVar10;
  char *pcVar11;
  bnode *pbVar12;
  char *pcVar13;
  ulong uVar14;
  long lVar15;
  ushort uVar16;
  undefined8 unaff_R13;
  undefined4 *puVar17;
  void *pvVar18;
  undefined8 auStack_1c0 [2];
  undefined4 uStack_1ac;
  long alStack_1a8 [12];
  undefined4 uStack_144;
  undefined1 auStack_140 [16];
  char acStack_130 [80];
  undefined8 auStack_e0 [15];
  undefined4 local_68 [12];
  undefined1 local_38 [8];
  timeval __test_begin;
  
  gettimeofday((timeval *)local_38,(__timezone_ptr_t)0x0);
  memleak_start();
  pbVar6 = (bnode *)malloc(0x1010);
  pbVar6->kvsize = 0x801;
  pbVar6->flag = 0;
  pbVar6->level = 1;
  pbVar6->nentry = 0;
  (pbVar6->field_4).data = pbVar6 + 1;
  uVar14 = 0;
  pcVar11 = (char *)(auStack_e0 + 5);
  do {
    pcVar10 = pcVar11;
    pcVar11 = pcVar10 + -0x10;
    auStack_e0[uVar14 + 5] = pcVar11;
    pcVar10[-0x18] = -0x44;
    pcVar10[-0x17] = '8';
    pcVar10[-0x16] = '\x10';
    pcVar10[-0x15] = '\0';
    pcVar10[-0x14] = '\0';
    pcVar10[-0x13] = '\0';
    pcVar10[-0x12] = '\0';
    pcVar10[-0x11] = '\0';
    sprintf(pcVar11,"key%d",uVar14 & 0xffffffff);
    local_68[uVar14] = (int)uVar14;
    uVar14 = uVar14 + 1;
  } while (uVar14 != 10);
  puVar17 = local_68;
  p_Var1 = kv_ops->get_data_size;
  pcVar10[-0x18] = -0x1a;
  pcVar10[-0x17] = '8';
  pcVar10[-0x16] = '\x10';
  pcVar10[-0x15] = '\0';
  pcVar10[-0x14] = '\0';
  pcVar10[-0x13] = '\0';
  pcVar10[-0x12] = '\0';
  pcVar10[-0x11] = '\0';
  pbVar12 = pbVar6;
  sVar7 = (*p_Var1)(pbVar6,(void *)0x0,auStack_e0 + 5,puVar17,2);
  if (sVar7 == 0x12) {
    lVar15 = 0;
    do {
      pvVar18 = (void *)auStack_e0[lVar15 + 5];
      p_Var2 = kv_ops->set_kv;
      builtin_strncpy(pcVar10 + -0x18,"\x049\x10",4);
      pcVar10[-0x14] = '\0';
      pcVar10[-0x13] = '\0';
      pcVar10[-0x12] = '\0';
      pcVar10[-0x11] = '\0';
      (*p_Var2)(pbVar6,(idx_t)lVar15,pvVar18,puVar17);
      lVar15 = lVar15 + 1;
      puVar17 = puVar17 + 1;
    } while (lVar15 != 10);
    pbVar6->nentry = 10;
    p_Var1 = kv_ops->get_data_size;
    builtin_strncpy(pcVar10 + -0x18,"19\x10",4);
    pcVar10[-0x14] = '\0';
    pcVar10[-0x13] = '\0';
    pcVar10[-0x12] = '\0';
    pcVar10[-0x11] = '\0';
    pbVar12 = pbVar6;
    sVar7 = (*p_Var1)(pbVar6,(void *)0x0,auStack_e0 + 5,local_68,10);
    if (sVar7 == 0xb4) {
      builtin_strncpy(pcVar10 + -0x18,"E9\x10",4);
      pcVar10[-0x14] = '\0';
      pcVar10[-0x13] = '\0';
      pcVar10[-0x12] = '\0';
      pcVar10[-0x11] = '\0';
      kv_get_str_data_size_test();
      return;
    }
  }
  else {
    builtin_strncpy(pcVar10 + -0x18,"W9\x10",4);
    pcVar10[-0x14] = '\0';
    pcVar10[-0x13] = '\0';
    pcVar10[-0x12] = '\0';
    pcVar10[-0x11] = '\0';
    kv_get_str_data_size_test();
  }
  *(code **)(pcVar10 + -0x18) = kv_get_str_kv_size_test;
  kv_get_str_data_size_test();
  *(undefined4 **)(pcVar10 + -0x18) = puVar17;
  *(bnode **)(pcVar10 + -0x20) = pbVar6;
  *(btree_kv_ops **)(pcVar10 + -0x28) = kv_ops;
  pcVar10[-0xa0] = 't';
  pcVar10[-0x9f] = '9';
  pcVar10[-0x9e] = '\x10';
  pcVar10[-0x9d] = '\0';
  pcVar10[-0x9c] = '\0';
  pcVar10[-0x9b] = '\0';
  pcVar10[-0x9a] = '\0';
  pcVar10[-0x99] = '\0';
  gettimeofday((timeval *)(pcVar10 + -0x38),(__timezone_ptr_t)0x0);
  pcVar10[-0xa0] = 'y';
  pcVar10[-0x9f] = '9';
  pcVar10[-0x9e] = '\x10';
  pcVar10[-0x9d] = '\0';
  pcVar10[-0x9c] = '\0';
  pcVar10[-0x9b] = '\0';
  pcVar10[-0x9a] = '\0';
  pcVar10[-0x99] = '\0';
  memleak_start();
  pcVar11 = pcVar10 + -0x88;
  pcVar11[0] = 't';
  pcVar11[1] = 'e';
  pcVar11[2] = 's';
  pcVar11[3] = 't';
  pcVar11[4] = 's';
  pcVar11[5] = 't';
  pcVar11[6] = 'r';
  pcVar11[7] = 'i';
  pcVar10[-0x81] = 'i';
  pcVar10[-0x80] = 'n';
  pcVar10[-0x7f] = 'g';
  pcVar10[-0x7e] = '\0';
  pcVar10[-0xa0] = -0x65;
  pcVar10[-0x9f] = '9';
  pcVar10[-0x9e] = '\x10';
  pcVar10[-0x9d] = '\0';
  pcVar10[-0x9c] = '\0';
  pcVar10[-0x9b] = '\0';
  pcVar10[-0x9a] = '\0';
  pcVar10[-0x99] = '\0';
  sVar8 = strlen(pcVar11);
  pcVar10[-0x78] = (char)sVar8;
  pcVar10[-0x77] = '\x04';
  pcVar10[-0x8c] = '\x01';
  pcVar10[-0x8b] = '\0';
  pcVar10[-0x8a] = '\0';
  pcVar10[-0x89] = '\0';
  aVar3 = pbVar12[2].field_4;
  pcVar10[-0xa0] = -0x49;
  pcVar10[-0x9f] = '9';
  pcVar10[-0x9e] = '\x10';
  pcVar10[-0x9d] = '\0';
  pcVar10[-0x9c] = '\0';
  pcVar10[-0x9b] = '\0';
  pcVar10[-0x9a] = '\0';
  pcVar10[-0x99] = '\0';
  lVar15 = (*(code *)aVar3)(pcVar10 + -0x78,pcVar11);
  pcVar10[-0xa0] = -0x3e;
  pcVar10[-0x9f] = '9';
  pcVar10[-0x9e] = '\x10';
  pcVar10[-0x9d] = '\0';
  pcVar10[-0x9c] = '\0';
  pcVar10[-0x9b] = '\0';
  pcVar10[-0x9a] = '\0';
  pcVar10[-0x99] = '\0';
  sVar8 = strlen(pcVar11);
  if (lVar15 != sVar8 + 4) {
    pcVar10[-0xa0] = -0x28;
    pcVar10[-0x9f] = '9';
    pcVar10[-0x9e] = '\x10';
    pcVar10[-0x9d] = '\0';
    pcVar10[-0x9c] = '\0';
    pcVar10[-0x9b] = '\0';
    pcVar10[-0x9a] = '\0';
    pcVar10[-0x99] = '\0';
    kv_get_str_kv_size_test();
  }
  aVar3 = pbVar12[2].field_4;
  pcVar10[-0xa0] = -0x16;
  pcVar10[-0x9f] = '9';
  pcVar10[-0x9e] = '\x10';
  pcVar10[-0x9d] = '\0';
  pcVar10[-0x9c] = '\0';
  pcVar10[-0x9b] = '\0';
  pcVar10[-0x9a] = '\0';
  pcVar10[-0x99] = '\0';
  uVar14 = (*(code *)aVar3)(pcVar10 + -0x78,0,pcVar10 + -0x8c);
  if (uVar14 != (byte)pcVar10[-0x77]) {
    builtin_strncpy(pcVar10 + -0xa0,"\x01:\x10",4);
    pcVar10[-0x9c] = '\0';
    pcVar10[-0x9b] = '\0';
    pcVar10[-0x9a] = '\0';
    pcVar10[-0x99] = '\0';
    kv_get_str_kv_size_test();
  }
  pcVar11 = pcVar10 + -0x88;
  aVar3 = pbVar12[2].field_4;
  builtin_strncpy(pcVar10 + -0xa0,"\x13:\x10",4);
  pcVar10[-0x9c] = '\0';
  pcVar10[-0x9b] = '\0';
  pcVar10[-0x9a] = '\0';
  pcVar10[-0x99] = '\0';
  sVar8 = (*(code *)aVar3)(pcVar10 + -0x78,pcVar11,0);
  builtin_strncpy(pcVar10 + -0xa0,"\x1e:\x10",4);
  pcVar10[-0x9c] = '\0';
  pcVar10[-0x9b] = '\0';
  pcVar10[-0x9a] = '\0';
  pcVar10[-0x99] = '\0';
  sVar9 = strlen(pcVar11);
  if (sVar8 != sVar9) {
    builtin_strncpy(pcVar10 + -0xa0,"0:\x10",4);
    pcVar10[-0x9c] = '\0';
    pcVar10[-0x9b] = '\0';
    pcVar10[-0x9a] = '\0';
    pcVar10[-0x99] = '\0';
    kv_get_str_kv_size_test();
  }
  pcVar13 = pcVar10 + -0x78;
  aVar3 = pbVar12[2].field_4;
  builtin_strncpy(pcVar10 + -0xa0,"<:\x10",4);
  pcVar10[-0x9c] = '\0';
  pcVar10[-0x9b] = '\0';
  pcVar10[-0x9a] = '\0';
  pcVar10[-0x99] = '\0';
  lVar15 = (*(code *)aVar3)(pcVar13,0,0);
  if (lVar15 == 0) {
    builtin_strncpy(pcVar10 + -0xa0,"F:\x10",4);
    pcVar10[-0x9c] = '\0';
    pcVar10[-0x9b] = '\0';
    pcVar10[-0x9a] = '\0';
    pcVar10[-0x99] = '\0';
    memleak_end();
    pcVar11 = "%s PASSED\n";
    if (kv_get_str_kv_size_test(btree_kv_ops*)::__test_pass != '\0') {
      pcVar11 = "%s FAILED\n";
    }
    builtin_strncpy(pcVar10 + -0xa0,"w:\x10",4);
    pcVar10[-0x9c] = '\0';
    pcVar10[-0x9b] = '\0';
    pcVar10[-0x9a] = '\0';
    pcVar10[-0x99] = '\0';
    fprintf(_stderr,pcVar11,"kv_get_str_kv_size_test");
    return;
  }
  *(code **)(pcVar10 + -0xa0) = kv_copy_var_test;
  kv_get_str_kv_size_test();
  *(undefined1 **)(pcVar10 + -0xa0) = &stack0xfffffffffffffff8;
  *(char **)(pcVar10 + -0xa8) = pcVar11;
  *(size_t *)(pcVar10 + -0xb0) = sVar8;
  *(undefined8 *)(pcVar10 + -0xb8) = unaff_R13;
  pcVar10[-0xc0] = '\n';
  pcVar10[-0xbf] = '\0';
  pcVar10[-0xbe] = '\0';
  pcVar10[-0xbd] = '\0';
  pcVar10[-0xbc] = '\0';
  pcVar10[-0xbb] = '\0';
  pcVar10[-0xba] = '\0';
  pcVar10[-0xb9] = '\0';
  *(bnode **)(pcVar10 + -200) = pbVar12;
  pcVar10[-0x108] = -0x5d;
  pcVar10[-0x107] = ':';
  pcVar10[-0x106] = '\x10';
  pcVar10[-0x105] = '\0';
  pcVar10[-0x104] = '\0';
  pcVar10[-0x103] = '\0';
  pcVar10[-0x102] = '\0';
  pcVar10[-0x101] = '\0';
  gettimeofday((timeval *)(pcVar10 + -0xd8),(__timezone_ptr_t)0x0);
  pcVar10[-0x108] = -0x58;
  pcVar10[-0x107] = ':';
  pcVar10[-0x106] = '\x10';
  pcVar10[-0x105] = '\0';
  pcVar10[-0x104] = '\0';
  pcVar10[-0x103] = '\0';
  pcVar10[-0x102] = '\0';
  pcVar10[-0x101] = '\0';
  memleak_start();
  pcVar11 = pcVar10 + -0xf4;
  pcVar11[0] = 'k';
  pcVar11[1] = 'e';
  pcVar11[2] = 'y';
  pcVar11[3] = '\0';
  pcVar10[-0x108] = -0x48;
  pcVar10[-0x107] = ':';
  pcVar10[-0x106] = '\x10';
  pcVar10[-0x105] = '\0';
  pcVar10[-0x104] = '\0';
  pcVar10[-0x103] = '\0';
  pcVar10[-0x102] = '\0';
  pcVar10[-0x101] = '\0';
  sVar8 = strlen(pcVar11);
  pcVar10[-0xf0] = '@';
  pcVar10[-0xef] = '\0';
  pcVar10[-0xee] = '\0';
  pcVar10[-0xed] = '\0';
  pcVar10[-0xec] = '\0';
  pcVar10[-0xeb] = '\0';
  pcVar10[-0xea] = '\0';
  pcVar10[-0xe9] = '\0';
  pcVar10[-0x108] = -0x2f;
  pcVar10[-0x107] = ':';
  pcVar10[-0x106] = '\x10';
  pcVar10[-0x105] = '\0';
  pcVar10[-0x104] = '\0';
  pcVar10[-0x103] = '\0';
  pcVar10[-0x102] = '\0';
  pcVar10[-0x101] = '\0';
  __ptr = (ushort *)malloc(0x1010);
  __ptr[0] = 0;
  __ptr[1] = 0;
  __ptr[2] = 1;
  __ptr[3] = 0;
  uVar16 = (ushort)((int)sVar8 << 8) | 8;
  *__ptr = uVar16;
  *(ushort **)(pcVar10 + -0xe8) = __ptr + 4;
  *(ushort **)(__ptr + 4) = __ptr + 8;
  pcVar10[-0x108] = '\v';
  pcVar10[-0x107] = ';';
  pcVar10[-0x106] = '\x10';
  pcVar10[-0x105] = '\0';
  pcVar10[-0x104] = '\0';
  pcVar10[-0x103] = '\0';
  pcVar10[-0x102] = '\0';
  pcVar10[-0x101] = '\0';
  __ptr_00 = (ushort *)malloc(0x1010);
  __ptr_00[0] = 0;
  __ptr_00[1] = 0;
  __ptr_00[2] = 1;
  __ptr_00[3] = 0;
  *__ptr_00 = uVar16;
  *(ushort **)(__ptr_00 + 4) = __ptr_00 + 8;
  pcVar4 = *(code **)(pcVar13 + 8);
  pcVar10[-0x108] = '4';
  pcVar10[-0x107] = ';';
  pcVar10[-0x106] = '\x10';
  pcVar10[-0x105] = '\0';
  pcVar10[-0x104] = '\0';
  pcVar10[-0x103] = '\0';
  pcVar10[-0x102] = '\0';
  pcVar10[-0x101] = '\0';
  (*pcVar4)(__ptr_00,0,pcVar10 + -0xf4,pcVar10 + -0xf0);
  pcVar4 = *(code **)(pcVar13 + 0x18);
  pcVar10[-0x108] = 'I';
  pcVar10[-0x107] = ';';
  pcVar10[-0x106] = '\x10';
  pcVar10[-0x105] = '\0';
  pcVar10[-0x104] = '\0';
  pcVar10[-0x103] = '\0';
  pcVar10[-0x102] = '\0';
  pcVar10[-0x101] = '\0';
  (*pcVar4)(__ptr,__ptr_00,0,0,1);
  pvVar18 = *(void **)(__ptr + 4);
  pcVar10[-0x108] = '_';
  pcVar10[-0x107] = ';';
  pcVar10[-0x106] = '\x10';
  pcVar10[-0x105] = '\0';
  pcVar10[-0x104] = '\0';
  pcVar10[-0x103] = '\0';
  pcVar10[-0x102] = '\0';
  pcVar10[-0x101] = '\0';
  iVar5 = bcmp(pvVar18,pcVar10 + -0xf4,sVar8 & 0xff);
  if (iVar5 != 0) {
    builtin_strncpy(pcVar10 + -0x108,"};\x10",4);
    pcVar10[-0x104] = '\0';
    pcVar10[-0x103] = '\0';
    pcVar10[-0x102] = '\0';
    pcVar10[-0x101] = '\0';
    kv_copy_var_test();
    pvVar18 = *(void **)(pcVar10 + -0xe0);
  }
  if (*(long *)((long)pvVar18 + (sVar8 & 0xff)) != *(long *)(pcVar10 + -0xf0)) {
    pcVar10[-0x108] = -99;
    pcVar10[-0x107] = ';';
    pcVar10[-0x106] = '\x10';
    pcVar10[-0x105] = '\0';
    pcVar10[-0x104] = '\0';
    pcVar10[-0x103] = '\0';
    pcVar10[-0x102] = '\0';
    pcVar10[-0x101] = '\0';
    kv_copy_var_test();
  }
  pcVar10[-0x108] = -0x5b;
  pcVar10[-0x107] = ';';
  pcVar10[-0x106] = '\x10';
  pcVar10[-0x105] = '\0';
  pcVar10[-0x104] = '\0';
  pcVar10[-0x103] = '\0';
  pcVar10[-0x102] = '\0';
  pcVar10[-0x101] = '\0';
  free(__ptr_00);
  pcVar10[-0x108] = -0x53;
  pcVar10[-0x107] = ';';
  pcVar10[-0x106] = '\x10';
  pcVar10[-0x105] = '\0';
  pcVar10[-0x104] = '\0';
  pcVar10[-0x103] = '\0';
  pcVar10[-0x102] = '\0';
  pcVar10[-0x101] = '\0';
  free(__ptr);
  pcVar10[-0x108] = -0x4e;
  pcVar10[-0x107] = ';';
  pcVar10[-0x106] = '\x10';
  pcVar10[-0x105] = '\0';
  pcVar10[-0x104] = '\0';
  pcVar10[-0x103] = '\0';
  pcVar10[-0x102] = '\0';
  pcVar10[-0x101] = '\0';
  memleak_end();
  pcVar11 = "%s PASSED\n";
  if (kv_copy_var_test(btree_kv_ops*)::__test_pass != '\0') {
    pcVar11 = "%s FAILED\n";
  }
  pcVar10[-0x108] = -0x1d;
  pcVar10[-0x107] = ';';
  pcVar10[-0x106] = '\x10';
  pcVar10[-0x105] = '\0';
  pcVar10[-0x104] = '\0';
  pcVar10[-0x103] = '\0';
  pcVar10[-0x102] = '\0';
  pcVar10[-0x101] = '\0';
  fprintf(_stderr,pcVar11,"kv_copy_var_test");
  return;
}

Assistant:

void kv_get_str_data_size_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();


    bnoderef node;
    uint8_t v;
    uint8_t i, n = 10;
    uint8_t ksize = 8;
    uint8_t vsize = sizeof(v);
    char **key = alca(char*, n);
    int *value = alca(int, n);
    void *new_minkey;
    size_t size;


    node = dummy_node(ksize, vsize, 1);
    node->nentry = 0;

    new_minkey = NULL;

    for (i = 0; i < n; i++){
        key[i] = alca(char, ksize);
        sprintf(key[i], "key%d", i);
        value[i] = i;
    }

    // calculate datasize to extend empty node
    size = kv_ops->get_data_size(node, new_minkey, key, value, 2);
    TEST_CHK(size == (size_t)(2*(ksize + vsize)));

    // set kvs
    for (i = 0; i < n; i++){
        kv_ops->set_kv(node, i, key[i], (void *)&value[i]);
    }

    // cacluate datasize to extend node with n entries
    node->nentry = n;
    size = kv_ops->get_data_size(node, new_minkey, key, value, n);
    TEST_CHK(size == (size_t)(2*(n*(ksize+vsize))));

    free(node);
    memleak_end();
    TEST_RESULT("kv_get_str_data_size_test");
}